

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O3

string * CLI::detail::fix_newlines(string *__return_storage_ptr__,string *leader,string *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  long lVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  string *local_a0;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  long *local_78;
  undefined8 local_70;
  long local_68;
  undefined8 uStack_60;
  string *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  uVar8 = 0;
  local_a0 = leader;
  local_58 = __return_storage_ptr__;
  do {
    if (input->_M_string_length <= uVar8) break;
    lVar4 = ::std::__cxx11::string::find((char)input,10);
    if (lVar4 == -1) break;
    ::std::__cxx11::string::substr((ulong)local_50,(ulong)input);
    plVar5 = (long *)::std::__cxx11::string::_M_append
                               ((char *)local_50,(ulong)(local_a0->_M_dataplus)._M_p);
    puVar7 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar7) {
      local_b0 = *puVar7;
      lStack_a8 = plVar5[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *puVar7;
      local_c0 = (ulong *)*plVar5;
    }
    local_b8 = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    ::std::__cxx11::string::substr((ulong)&local_98,(ulong)input);
    uVar8 = 0xf;
    if (local_c0 != &local_b0) {
      uVar8 = local_b0;
    }
    if (uVar8 < (ulong)(local_90 + local_b8)) {
      uVar8 = 0xf;
      if (local_98 != local_88) {
        uVar8 = local_88[0];
      }
      if (uVar8 < (ulong)(local_90 + local_b8)) goto LAB_0011fbb0;
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_c0);
    }
    else {
LAB_0011fbb0:
      puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_98);
    }
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_68 = *plVar5;
      uStack_60 = puVar6[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar5;
      local_78 = (long *)*puVar6;
    }
    local_70 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)plVar5 = 0;
    ::std::__cxx11::string::operator=((string *)input,(string *)&local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    uVar8 = lVar4 + local_a0->_M_string_length;
  } while (uVar8 != 0xffffffffffffffff);
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  pcVar2 = (input->_M_dataplus)._M_p;
  paVar1 = &input->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&input->field_2 + 8);
    (local_58->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&local_58->field_2 + 8) = uVar3;
  }
  else {
    (local_58->_M_dataplus)._M_p = pcVar2;
    (local_58->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_58->_M_string_length = input->_M_string_length;
  (input->_M_dataplus)._M_p = (pointer)paVar1;
  input->_M_string_length = 0;
  (input->field_2)._M_local_buf[0] = '\0';
  return local_58;
}

Assistant:

CLI11_INLINE std::string fix_newlines(const std::string &leader, std::string input) {
    std::string::size_type n = 0;
    while(n != std::string::npos && n < input.size()) {
        n = input.find('\n', n);
        if(n != std::string::npos) {
            input = input.substr(0, n + 1) + leader + input.substr(n + 1);
            n += leader.size();
        }
    }
    return input;
}